

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

uint Kit_TruthSemiCanonicize_Yasha1(word *pInOut,int nVars,char *pCanonPerm,int *pStore)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  uint local_40;
  uint uCanonPhase;
  int Temp;
  int nOnes;
  int fChange;
  int i;
  int nWords;
  int *pStore_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *pInOut_local;
  
  iVar3 = Kit_TruthWordNum_64bit(nVars);
  local_40 = 0;
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                  ,0xfb,"unsigned int Kit_TruthSemiCanonicize_Yasha1(word *, int, char *, int *)");
  }
  uCanonPhase = Kit_TruthCountOnes_64bit(pInOut,nVars);
  bVar4 = (byte)nVars;
  if (uCanonPhase == iVar3 << 5) {
    local_40 = 1 << (bVar4 + 2 & 0x1f);
  }
  else if (iVar3 * 0x20 < (int)uCanonPhase) {
    local_40 = 1 << (bVar4 & 0x1f);
    Kit_TruthNot_64bit(pInOut,nVars);
    uCanonPhase = iVar3 * 0x40 - uCanonPhase;
  }
  Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
  for (nOnes = 0; nOnes < nVars; nOnes = nOnes + 1) {
    if (pStore[nOnes] << 1 == uCanonPhase) {
      local_40 = 1 << (bVar4 + 1 & 0x1f) | local_40;
    }
    else if (pStore[nOnes] <= (int)(uCanonPhase - pStore[nOnes])) {
      local_40 = 1 << ((byte)nOnes & 0x1f) | local_40;
      pStore[nOnes] = uCanonPhase - pStore[nOnes];
      Kit_TruthChangePhase_64bit(pInOut,nVars,nOnes);
    }
  }
  do {
    bVar2 = false;
    for (nOnes = 0; nOnes < nVars + -1; nOnes = nOnes + 1) {
      if (pStore[nOnes + 1] < pStore[nOnes]) {
        bVar2 = true;
        cVar1 = pCanonPerm[nOnes];
        pCanonPerm[nOnes] = pCanonPerm[nOnes + 1];
        pCanonPerm[nOnes + 1] = cVar1;
        iVar3 = pStore[nOnes];
        pStore[nOnes] = pStore[nOnes + 1];
        pStore[nOnes + 1] = iVar3;
        bVar4 = (byte)nOnes;
        if (((local_40 & 1 << (bVar4 & 0x1f)) != 0) != ((local_40 & 1 << (bVar4 + 1 & 0x1f)) != 0))
        {
          local_40 = 1 << (bVar4 + 1 & 0x1f) ^ 1 << (bVar4 & 0x1f) ^ local_40;
        }
        Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,nOnes);
      }
    }
  } while (bVar2);
  return local_40;
}

Assistant:

unsigned  Kit_TruthSemiCanonicize_Yasha1( word* pInOut, int nVars, char * pCanonPerm, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, fChange, nOnes;
    int Temp;
    unsigned  uCanonPhase=0;
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    if ( nOnes == nWords * 32 )
        uCanonPhase |= (1 << (nVars+2));
    
    else if ( (nOnes > nWords * 32) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if (  2*pStore[i]  == nOnes)
        {
            uCanonPhase |= (1 << (nVars+1));
            continue;
        }
        if ( pStore[i] > nOnes-pStore[i])
            continue;
        uCanonPhase |= (1 << i);
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;
            
            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange );
    return uCanonPhase;
}